

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O2

void hbd_obmc_variance_w4
               (uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,uint64_t *sse,int64_t *sum,
               int h)

{
  int *piVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  puVar2 = (undefined8 *)((long)pre8 * 2);
  uVar3 = 0;
  auVar7 = pmovsxwd(in_XMM2,0x800080008000800);
  auVar5 = (undefined1  [16])0x0;
  auVar6 = (undefined1  [16])0x0;
  do {
    auVar8 = pmovzxwd(in_XMM3,*puVar2);
    piVar1 = wsrc + uVar3;
    auVar8 = pmaddwd(auVar8,*(undefined1 (*) [16])(mask + uVar3));
    iVar10 = *piVar1 - auVar8._0_4_;
    iVar11 = piVar1[1] - auVar8._4_4_;
    iVar12 = piVar1[2] - auVar8._8_4_;
    iVar13 = piVar1[3] - auVar8._12_4_;
    auVar9._0_4_ = (iVar10 >> 0x1f) + iVar10 + auVar7._0_4_ >> 0xc;
    auVar9._4_4_ = (iVar11 >> 0x1f) + iVar11 + auVar7._4_4_ >> 0xc;
    auVar9._8_4_ = (iVar12 >> 0x1f) + iVar12 + auVar7._8_4_ >> 0xc;
    auVar9._12_4_ = (iVar13 >> 0x1f) + iVar13 + auVar7._12_4_ >> 0xc;
    auVar4._0_4_ = auVar6._0_4_ + auVar9._0_4_;
    auVar4._4_4_ = auVar6._4_4_ + auVar9._4_4_;
    auVar4._8_4_ = auVar6._8_4_ + auVar9._8_4_;
    auVar4._12_4_ = auVar6._12_4_ + auVar9._12_4_;
    in_XMM3 = pmulld(auVar9,auVar9);
    auVar8._0_4_ = auVar5._0_4_ + in_XMM3._0_4_;
    auVar8._4_4_ = auVar5._4_4_ + in_XMM3._4_4_;
    auVar8._8_4_ = auVar5._8_4_ + in_XMM3._8_4_;
    auVar8._12_4_ = auVar5._12_4_ + in_XMM3._12_4_;
    uVar3 = uVar3 + 4;
    puVar2 = (undefined8 *)((long)puVar2 + (long)(pre_stride + -4) * 2 + 8);
    auVar5 = auVar8;
    auVar6 = auVar4;
  } while (uVar3 < (uint)(h << 2));
  auVar5 = phaddd(auVar4,auVar4);
  auVar6 = phaddd(auVar5,auVar5);
  auVar5 = phaddd(auVar8,auVar8);
  auVar5 = phaddd(auVar5,auVar5);
  *sum = (long)auVar6._0_4_;
  *sse = (long)auVar5._0_4_;
  return;
}

Assistant:

static inline void hbd_obmc_variance_w4(
    const uint8_t *pre8, const int pre_stride, const int32_t *wsrc,
    const int32_t *mask, uint64_t *const sse, int64_t *const sum, const int h) {
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  const int pre_step = pre_stride - 4;
  int n = 0;
  __m128i v_sum_d = _mm_setzero_si128();
  __m128i v_sse_d = _mm_setzero_si128();

  assert(IS_POWER_OF_TWO(h));

  do {
    const __m128i v_p_w = xx_loadl_64(pre + n);
    const __m128i v_m_d = xx_load_128(mask + n);
    const __m128i v_w_d = xx_load_128(wsrc + n);

    const __m128i v_p_d = _mm_cvtepu16_epi32(v_p_w);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm_d = _mm_madd_epi16(v_p_d, v_m_d);

    const __m128i v_diff_d = _mm_sub_epi32(v_w_d, v_pm_d);
    const __m128i v_rdiff_d = xx_roundn_epi32(v_diff_d, 12);
    const __m128i v_sqrdiff_d = _mm_mullo_epi32(v_rdiff_d, v_rdiff_d);

    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff_d);
    v_sse_d = _mm_add_epi32(v_sse_d, v_sqrdiff_d);

    n += 4;

    if (n % 4 == 0) pre += pre_step;
  } while (n < 4 * h);

  *sum = xx_hsum_epi32_si32(v_sum_d);
  *sse = xx_hsum_epi32_si32(v_sse_d);
}